

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxStackVariable::FxStackVariable(FxStackVariable *this,PType *type,int offset,FScriptPosition *pos)

{
  uint in_EAX;
  PField *this_00;
  undefined8 uStack_38;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  uStack_38._0_4_ = in_EAX;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_StackVariable;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStackVariable_007108c8;
  this_00 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  uStack_38 = (ulong)(uint)uStack_38;
  PField::PField(this_00,(FName *)((long)&uStack_38 + 4),type,0,(long)offset,0);
  this->membervar = this_00;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxStackVariable::FxStackVariable(PType *type, int offset, const FScriptPosition &pos)
	: FxExpression(EFX_StackVariable, pos)
{
	membervar = new PField(NAME_None, type, 0, offset);
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}